

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  bool bVar1;
  ParseArgumentStatus PVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference virtual_path;
  reference pvVar6;
  ulong uVar7;
  reference pvVar8;
  string *psVar9;
  ostream *poVar10;
  FileDescriptor *pFVar11;
  reference pvVar12;
  GeneratorContextImpl *pGVar13;
  pointer ppVar14;
  DescriptorProto *this_00;
  DescriptorPool *pool_00;
  reference ppFVar15;
  Descriptor *descriptor;
  LogMessage *pLVar16;
  byte local_5ca;
  LogFinisher local_4e9;
  LogMessage local_4e8;
  int local_4ac;
  value_type pFStack_4a8;
  int j;
  FileDescriptor *fd;
  int i_4;
  undefined1 local_460 [8];
  FileDescriptorProto file;
  DescriptorPool pool;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  GeneratorContextImpl *local_2d0;
  GeneratorContextImpl *directory;
  string *location;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
  local_2b8;
  iterator iter;
  GeneratorContextImpl **map_slot;
  string local_2a0;
  allocator local_279;
  string local_278;
  undefined1 local_258 [8];
  string output_location;
  int i_3;
  GeneratorContextMap output_directories;
  string local_1f0;
  string local_1d0;
  _Self local_1b0;
  _Self local_1a8;
  int local_1a0;
  byte local_199;
  int i_2;
  bool indirect_imports;
  FileDescriptor *parsed_file;
  undefined1 local_188 [4];
  int i_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  Importer importer;
  ErrorPrinter error_collector;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  DiskSourceTree source_tree;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  source_tree.last_error_message_.field_2._8_8_ = argv;
  Clear(this);
  PVar2 = ParseArguments(this,argc,(char **)source_tree.last_error_message_.field_2._8_8_);
  if (PVar2 != PARSE_ARGUMENT_DONE_AND_CONTINUE) {
    if (PVar2 == PARSE_ARGUMENT_DONE_AND_EXIT) {
      return 0;
    }
    if (PVar2 == PARSE_ARGUMENT_FAIL) {
      return 1;
    }
  }
  anon_unknown_0::AddDefaultProtoPaths(&this->proto_path_);
  DiskSourceTree::DiskSourceTree((DiskSourceTree *)local_68);
  for (local_6c = 0;
      sVar5 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(&this->proto_path_), (ulong)(long)local_6c < sVar5; local_6c = local_6c + 1) {
    virtual_path = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->proto_path_,(long)local_6c);
    pvVar6 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->proto_path_,(long)local_6c);
    DiskSourceTree::MapPath((DiskSourceTree *)local_68,&virtual_path->first,&pvVar6->second);
  }
  if (((this->inputs_are_proto_path_relative_ & 1U) == 0) &&
     (bVar1 = MakeInputsBeProtoPathRelative(this,(DiskSourceTree *)local_68), !bVar1)) {
    this_local._4_4_ = 1;
    goto LAB_00359465;
  }
  ErrorPrinter::ErrorPrinter
            ((ErrorPrinter *)&importer.pool_.disallow_enforce_utf8_,this->error_format_,
             (DiskSourceTree *)local_68);
  Importer::Importer((Importer *)
                     &parsed_files.
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(SourceTree *)local_68,
                     (MultiFileErrorCollector *)&importer.pool_.disallow_enforce_utf8_);
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)local_188);
  for (parsed_file._4_4_ = 0; uVar7 = (ulong)parsed_file._4_4_,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->input_files_), uVar7 < sVar5; parsed_file._4_4_ = parsed_file._4_4_ + 1)
  {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->input_files_,(long)parsed_file._4_4_);
    Importer::AddUnusedImportTrackFile
              ((Importer *)
               &parsed_files.
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->input_files_,(long)parsed_file._4_4_);
    _i_2 = Importer::Import((Importer *)
                            &parsed_files.
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
    Importer::ClearUnusedImportTrackFiles
              ((Importer *)
               &parsed_files.
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (_i_2 == (FileDescriptor *)0x0) {
      this_local._4_4_ = 1;
      goto LAB_00359419;
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_188,(value_type *)&i_2);
    if (((this->disallow_services_ & 1U) != 0) &&
       (iVar3 = FileDescriptor::service_count(_i_2), 0 < iVar3)) {
      psVar9 = FileDescriptor::name_abi_cxx11_(_i_2);
      poVar10 = std::operator<<((ostream *)&std::cerr,(string *)psVar9);
      poVar10 = std::operator<<(poVar10,
                                ": This file contains services, but --disallow_services was used.");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = 1;
      goto LAB_00359419;
    }
    if ((this->direct_dependencies_explicitly_set_ & 1U) != 0) {
      local_199 = 0;
      for (local_1a0 = 0; iVar3 = local_1a0, iVar4 = FileDescriptor::dependency_count(_i_2),
          iVar3 < iVar4; local_1a0 = local_1a0 + 1) {
        pFVar11 = FileDescriptor::dependency(_i_2,local_1a0);
        psVar9 = FileDescriptor::name_abi_cxx11_(pFVar11);
        local_1a8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->direct_dependencies_,psVar9);
        local_1b0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->direct_dependencies_);
        bVar1 = std::operator==(&local_1a8,&local_1b0);
        if (bVar1) {
          local_199 = 1;
          psVar9 = FileDescriptor::name_abi_cxx11_(_i_2);
          poVar10 = std::operator<<((ostream *)&std::cerr,(string *)psVar9);
          poVar10 = std::operator<<(poVar10,": ");
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1f0,"%s",
                     (allocator *)
                     ((long)&output_directories.
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                             ._M_h._M_single_bucket + 7));
          pFVar11 = FileDescriptor::dependency(_i_2,local_1a0);
          psVar9 = FileDescriptor::name_abi_cxx11_(pFVar11);
          StringReplace(&local_1d0,&this->direct_dependencies_violation_msg_,&local_1f0,psVar9,true)
          ;
          poVar10 = std::operator<<(poVar10,(string *)&local_1d0);
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&output_directories.
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                             ._M_h._M_single_bucket + 7));
        }
      }
      if ((local_199 & 1) != 0) {
        this_local._4_4_ = 1;
        goto LAB_00359419;
      }
    }
  }
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>
               *)(output_location.field_2._M_local_buf + 0xd));
  hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
  ::hash_map((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
              *)&i_3,0,
             (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(output_location.field_2._M_local_buf + 0xf),
             (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(output_location.field_2._M_local_buf + 0xe),
             (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>
              *)(output_location.field_2._M_local_buf + 0xd));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>
                *)(output_location.field_2._M_local_buf + 0xd));
  if (this->mode_ == MODE_COMPILE) {
    for (output_location.field_2._8_4_ = 0; uVar7 = (ulong)(int)output_location.field_2._8_4_,
        sVar5 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::size(&this->output_directives_), uVar7 < sVar5;
        output_location.field_2._8_4_ = output_location.field_2._8_4_ + 1) {
      pvVar12 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::operator[](&this->output_directives_,(long)(int)output_location.field_2._8_4_);
      std::__cxx11::string::string((string *)local_258,(string *)&pvVar12->output_location);
      std::allocator<char>::allocator();
      map_slot._6_1_ = 0;
      map_slot._5_1_ = 0;
      std::__cxx11::string::string((string *)&local_278,".zip",&local_279);
      bVar1 = HasSuffixString((string *)local_258,&local_278);
      local_5ca = 0;
      if (!bVar1) {
        std::allocator<char>::allocator();
        map_slot._6_1_ = 1;
        std::__cxx11::string::string((string *)&local_2a0,".jar",(allocator *)((long)&map_slot + 7))
        ;
        map_slot._5_1_ = 1;
        bVar1 = HasSuffixString((string *)local_258,&local_2a0);
        local_5ca = bVar1 ^ 0xff;
      }
      if ((map_slot._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      if ((map_slot._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&map_slot + 7));
      }
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      if ((local_5ca & 1) != 0) {
        anon_unknown_0::AddTrailingSlash((string *)local_258);
      }
      iter.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
                 )std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                                *)&i_3,(key_type *)local_258);
      if ((mapped_type)
          (((__node_type *)
           iter.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
           ._M_cur)->super__Hash_node_base)._M_nxt == (mapped_type)0x0) {
        pGVar13 = (GeneratorContextImpl *)operator_new(0x48);
        GeneratorContextImpl::GeneratorContextImpl
                  (pGVar13,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)local_188);
        *(GeneratorContextImpl **)
         iter.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
         ._M_cur = pGVar13;
      }
      pvVar12 = std::
                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ::operator[](&this->output_directives_,(long)(int)output_location.field_2._8_4_);
      bVar1 = GenerateOutput(this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   *)local_188,pvVar12,
                             *(GeneratorContext **)
                              iter.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
                              ._M_cur);
      if (!bVar1) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&i_3);
        this_local._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_258);
      if (!bVar1) goto LAB_003593fd;
    }
  }
  local_2b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                *)&i_3);
  while( true ) {
    location = (string *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                      *)&i_3);
    bVar1 = std::__detail::operator!=
                      (&local_2b8,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_true>
                        *)&location);
    if (!bVar1) break;
    directory = (GeneratorContextImpl *)
                std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_false,_true>
                ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_false,_true>
                              *)&local_2b8);
    ppVar14 = std::__detail::
              _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_false,_true>
              ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_false,_true>
                            *)&local_2b8);
    pGVar13 = directory;
    local_2d0 = ppVar14->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"/",&local_2f1);
    bVar1 = HasSuffixString((string *)pGVar13,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    pGVar13 = directory;
    if (bVar1) {
      bVar1 = GeneratorContextImpl::WriteAllToDisk(local_2d0,(string *)directory);
      if (!bVar1) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&i_3);
        this_local._4_4_ = 1;
        goto LAB_003593fd;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_318,".jar",(allocator *)&pool.field_0x67);
      bVar1 = HasSuffixString((string *)pGVar13,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)&pool.field_0x67);
      if (bVar1) {
        GeneratorContextImpl::AddJarManifest(local_2d0);
      }
      bVar1 = GeneratorContextImpl::WriteAllToZip(local_2d0,(string *)directory);
      if (!bVar1) {
        STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
                  ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                    *)&i_3);
        this_local._4_4_ = 1;
        goto LAB_003593fd;
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>,_false,_true>
                  *)&local_2b8);
  }
  uVar7 = std::__cxx11::string::empty();
  if (((uVar7 & 1) != 0) ||
     (bVar1 = GenerateDependencyManifestFile
                        (this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               *)local_188,(GeneratorContextMap *)&i_3,(DiskSourceTree *)local_68),
     bVar1)) {
    STLDeleteValues<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl*>>>>
              ((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
                *)&i_3);
    uVar7 = std::__cxx11::string::empty();
    if (((uVar7 & 1) != 0) ||
       (bVar1 = WriteDescriptorSet(this,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                         *)local_188), bVar1)) {
      if ((this->mode_ == MODE_ENCODE) || (this->mode_ == MODE_DECODE)) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pool_00 = Importer::pool((Importer *)
                                   &parsed_files.
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = EncodeOrDecode(this,pool_00);
          if (bVar1) goto LAB_00359206;
          this_local._4_4_ = 1;
        }
        else {
          DescriptorPool::DescriptorPool((DescriptorPool *)&file.source_code_info_);
          FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_460);
          FileDescriptorProto::set_name((FileDescriptorProto *)local_460,"empty_message.proto");
          this_00 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_460);
          DescriptorProto::set_name(this_00,"EmptyMessage");
          fd._7_1_ = 0;
          pFVar11 = DescriptorPool::BuildFile
                              ((DescriptorPool *)&file.source_code_info_,
                               (FileDescriptorProto *)local_460);
          if (pFVar11 == (FileDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&i_4,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x387);
            fd._7_1_ = 1;
            pLVar16 = internal::LogMessage::operator<<
                                ((LogMessage *)&i_4,"CHECK failed: pool.BuildFile(file) != NULL: ");
            internal::LogFinisher::operator=((LogFinisher *)((long)&fd + 6),pLVar16);
          }
          if ((fd._7_1_ & 1) != 0) {
            internal::LogMessage::~LogMessage((LogMessage *)&i_4);
          }
          std::__cxx11::string::operator=((string *)&this->codec_type_,"EmptyMessage");
          bVar1 = EncodeOrDecode(this,(DescriptorPool *)&file.source_code_info_);
          if (!bVar1) {
            this_local._4_4_ = 1;
          }
          FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_460);
          DescriptorPool::~DescriptorPool((DescriptorPool *)&file.source_code_info_);
          if (bVar1) goto LAB_00359206;
        }
      }
      else {
LAB_00359206:
        bVar1 = ErrorPrinter::FoundErrors((ErrorPrinter *)&importer.pool_.disallow_enforce_utf8_);
        if (bVar1) {
          this_local._4_4_ = 1;
        }
        else {
          if (this->mode_ == MODE_PRINT) {
            if (this->print_mode_ == PRINT_NONE) {
              internal::LogMessage::LogMessage
                        (&local_4e8,LOGLEVEL_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                         ,0x3a2);
              pLVar16 = internal::LogMessage::operator<<
                                  (&local_4e8,
                                   "If the code reaches here, it usually means a bug of flag parsing in the CommonadLineInterface."
                                  );
              internal::LogFinisher::operator=(&local_4e9,pLVar16);
              internal::LogMessage::~LogMessage(&local_4e8);
              this_local._4_4_ = 1;
              goto LAB_003593fd;
            }
            if (this->print_mode_ == PRINT_FREE_FIELDS) {
              for (fd._0_4_ = 0; uVar7 = (ulong)(int)fd,
                  sVar5 = std::
                          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ::size((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                  *)local_188), uVar7 < sVar5; fd._0_4_ = (int)fd + 1) {
                ppFVar15 = std::
                           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           ::operator[]((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                         *)local_188,(long)(int)fd);
                pFStack_4a8 = *ppFVar15;
                for (local_4ac = 0; iVar3 = local_4ac,
                    iVar4 = FileDescriptor::message_type_count(pFStack_4a8), iVar3 < iVar4;
                    local_4ac = local_4ac + 1) {
                  descriptor = FileDescriptor::message_type(pFStack_4a8,local_4ac);
                  PrintFreeFieldNumbers(this,descriptor);
                }
              }
            }
          }
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
LAB_003593fd:
  hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
  ::~hash_map((hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*>_>_>
               *)&i_3);
LAB_00359419:
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             *)local_188);
  Importer::~Importer((Importer *)
                      &parsed_files.
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ErrorPrinter::~ErrorPrinter((ErrorPrinter *)&importer.pool_.disallow_enforce_utf8_);
LAB_00359465:
  DiskSourceTree::~DiskSourceTree((DiskSourceTree *)local_68);
  return this_local._4_4_;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  DiskSourceTree source_tree;
  for (int i = 0; i < proto_path_.size(); i++) {
    source_tree.MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if necessary.
  if (!inputs_are_proto_path_relative_) {
    if (!MakeInputsBeProtoPathRelative(&source_tree)) {
      return 1;
    }
  }

  // Allocate the Importer.
  ErrorPrinter error_collector(error_format_, &source_tree);
  Importer importer(&source_tree, &error_collector);

  std::vector<const FileDescriptor*> parsed_files;

  // Parse each file.
  for (int i = 0; i < input_files_.size(); i++) {
    // Import the file.
    importer.AddUnusedImportTrackFile(input_files_[i]);
    const FileDescriptor* parsed_file = importer.Import(input_files_[i]);
    importer.ClearUnusedImportTrackFiles();
    if (parsed_file == NULL) return 1;
    parsed_files.push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      cerr << parsed_file->name() << ": This file contains services, but "
              "--disallow_services was used." << endl;
      return 1;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); i++) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << StringReplace(direct_dependencies_violation_msg_, "%s",
                                     parsed_file->dependency(i)->name(),
                                     true /* replace_all */)
                    << std::endl;
        }
      }
      if (indirect_imports) {
        return 1;
      }
    }
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar")) {
        AddTrailingSlash(&output_location);
      }
      GeneratorContextImpl** map_slot = &output_directories[output_location];

      if (*map_slot == NULL) {
        // First time we've seen this output location.
        *map_slot = new GeneratorContextImpl(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i], *map_slot)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (GeneratorContextMap::iterator iter = output_directories.begin();
       iter != output_directories.end(); ++iter) {
    const string& location = iter->first;
    GeneratorContextImpl* directory = iter->second;
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        STLDeleteValues(&output_directories);
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        &source_tree)) {
      return 1;
    }
  }

  STLDeleteValues(&output_directories);

  if (!descriptor_set_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(importer.pool())) {
        return 1;
      }
    }
  }

  if (error_collector.FoundErrors()) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                     "flag parsing in the CommonadLineInterface.";
        return 1;

      // Do not add a default case.
    }
  }

  return 0;
}